

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCUtil.cpp
# Opt level: O2

void Assimp::IFC::ConvertAxisPlacement(IfcMatrix4 *out,IfcAxis2Placement *in,ConversionData *conv)

{
  IfcAxis2Placement3D *in_00;
  IfcAxis2Placement2D *in_01;
  char *unaff_retaddr;
  
  in_00 = STEP::EXPRESS::DataType::ResolveSelectPtr<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D>
                    (in,conv->db);
  if (in_00 != (IfcAxis2Placement3D *)0x0) {
    ConvertAxisPlacement(out,in_00);
    return;
  }
  in_01 = STEP::EXPRESS::DataType::ResolveSelectPtr<Assimp::IFC::Schema_2x3::IfcAxis2Placement2D>
                    (in,conv->db);
  if (in_01 != (IfcAxis2Placement2D *)0x0) {
    ConvertAxisPlacement(out,in_01);
    return;
  }
  LogFunctions<Assimp::IFCImporter>::LogWarn(unaff_retaddr);
  return;
}

Assistant:

void ConvertAxisPlacement(IfcMatrix4& out, const Schema_2x3::IfcAxis2Placement& in, ConversionData& conv)
{
    if(const Schema_2x3::IfcAxis2Placement3D* pl3 = in.ResolveSelectPtr<Schema_2x3::IfcAxis2Placement3D>(conv.db)) {
        ConvertAxisPlacement(out,*pl3);
    }
    else if(const Schema_2x3::IfcAxis2Placement2D* pl2 = in.ResolveSelectPtr<Schema_2x3::IfcAxis2Placement2D>(conv.db)) {
        ConvertAxisPlacement(out,*pl2);
    }
    else {
        IFCImporter::LogWarn("skipping unknown IfcAxis2Placement entity");
    }
}